

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall cmLinkedTree<cmDefinitions>::Push(cmLinkedTree<cmDefinitions> *this,iterator it)

{
  iterator iVar1;
  iterator iVar2;
  cmDefinitions local_88;
  cmLinkedTree<cmDefinitions> *local_48;
  cmLinkedTree<cmDefinitions> *pcStack_40;
  cmLinkedTree<cmDefinitions> *local_30;
  cmLinkedTree<cmDefinitions> *this_local;
  iterator it_local;
  
  pcStack_40 = (cmLinkedTree<cmDefinitions> *)it.Position;
  local_48 = it.Tree;
  local_88.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_88.Map._M_h._M_rehash_policy._4_4_ = 0;
  local_88.Map._M_h._M_rehash_policy._M_next_resize = 0;
  local_88.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88.Map._M_h._M_element_count = 0;
  local_88.Map._M_h._M_buckets = (__buckets_ptr)0x0;
  local_88.Map._M_h._M_bucket_count = 0;
  local_88.Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_30 = this;
  this_local = local_48;
  it_local.Tree = pcStack_40;
  cmDefinitions::cmDefinitions(&local_88);
  iVar2.Position = (PositionType)pcStack_40;
  iVar2.Tree = local_48;
  iVar2 = Push_impl(this,iVar2,&local_88);
  it_local.Position = (PositionType)iVar2.Tree;
  cmDefinitions::~cmDefinitions(&local_88);
  iVar1.Position = iVar2.Position;
  iVar1.Tree = (cmLinkedTree<cmDefinitions> *)it_local.Position;
  return iVar1;
}

Assistant:

iterator Push(iterator it) { return this->Push_impl(it, T()); }